

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O0

bool __thiscall
duckdb::HashJoinGlobalSourceState::TryPrepareNextStage
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  HashJoinSourceStage HVar1;
  bool bVar2;
  TupleDataCollection *this_00;
  pointer pJVar3;
  __int_type _Var4;
  __int_type _Var5;
  HashJoinGlobalSinkState *in_RDI;
  HashJoinGlobalSourceState *unaff_retaddr;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
  *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  HVar1 = ::std::atomic<duckdb::HashJoinSourceStage>::load
                    ((atomic<duckdb::HashJoinSourceStage> *)&in_RDI->context,memory_order_seq_cst);
  if (HVar1 == BUILD) {
    if ((in_RDI->temporary_memory_state).
        super_unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::TemporaryMemoryState_*,_std::default_delete<duckdb::TemporaryMemoryState>_>
        .super__Head_base<0UL,_duckdb::TemporaryMemoryState_*,_false>._M_head_impl ==
        (TemporaryMemoryState *)in_RDI->num_threads) {
      unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
      operator->(in_stack_ffffffffffffffd0);
      this_00 = JoinHashTable::GetDataCollection((JoinHashTable *)0x1808b12);
      TupleDataCollection::VerifyEverythingPinned(this_00);
      pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
               operator->(in_stack_ffffffffffffffd0);
      pJVar3->finalized = true;
      PrepareProbe((HashJoinGlobalSourceState *)CONCAT17(HVar1,in_stack_ffffffffffffffe0),in_RDI);
      return true;
    }
  }
  else if (HVar1 == PROBE) {
    _Var4 = *(__int_type *)&in_RDI->finalized;
    _Var5 = ::std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    if (_Var4 == _Var5) {
      bVar2 = PropagatesBuildSide(*(JoinType *)
                                   (*(long *)&(in_RDI->super_GlobalSinkState).state + 0x81));
      if (bVar2) {
        PrepareScanHT((HashJoinGlobalSourceState *)CONCAT17(HVar1,in_stack_ffffffffffffffe0),in_RDI)
        ;
      }
      else {
        PrepareBuild(unaff_retaddr,
                     (HashJoinGlobalSinkState *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      }
      return true;
    }
  }
  else if (HVar1 == SCAN_HT) {
    _Var4 = ::std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    _Var5 = ::std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    if (_Var4 == _Var5) {
      PrepareBuild(unaff_retaddr,
                   (HashJoinGlobalSinkState *)
                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      return true;
    }
  }
  return false;
}

Assistant:

bool HashJoinGlobalSourceState::TryPrepareNextStage(HashJoinGlobalSinkState &sink) {
	switch (global_stage.load()) {
	case HashJoinSourceStage::BUILD:
		if (build_chunk_done == build_chunk_count) {
			sink.hash_table->GetDataCollection().VerifyEverythingPinned();
			sink.hash_table->finalized = true;
			PrepareProbe(sink);
			return true;
		}
		break;
	case HashJoinSourceStage::PROBE:
		if (probe_chunk_done == probe_chunk_count) {
			if (PropagatesBuildSide(op.join_type)) {
				PrepareScanHT(sink);
			} else {
				PrepareBuild(sink);
			}
			return true;
		}
		break;
	case HashJoinSourceStage::SCAN_HT:
		if (full_outer_chunk_done == full_outer_chunk_count) {
			PrepareBuild(sink);
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}